

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O1

void EPSG_setVolumeMode(EPSG *psg,int type)

{
  uint32_t (*pauVar1) [32];
  
  pauVar1 = voltbl + 1;
  if (type == 1) {
    pauVar1 = voltbl;
  }
  psg->voltbl = *pauVar1;
  return;
}

Assistant:

void
EPSG_setVolumeMode (EPSG * psg, int type)
{
  switch (type)
  {
  case 1:
    psg->voltbl = voltbl[EMU2149_VOL_YM2149];
    break;
  case 2:
    psg->voltbl = voltbl[EMU2149_VOL_AY_3_8910];
    break;
  default:
    psg->voltbl = voltbl[EMU2149_VOL_DEFAULT];
    break;
  }
}